

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::MeshXml::ConvertToAssimpScene(MeshXml *this,aiScene *dest)

{
  pointer ppAVar1;
  pointer ppAVar2;
  aiMesh **ppaVar3;
  aiNode *paVar4;
  uint *puVar5;
  aiMesh *paVar6;
  aiNode **ppaVar7;
  aiAnimation **ppaVar8;
  aiAnimation *paVar9;
  Skeleton *this_00;
  ulong uVar10;
  size_t len;
  long lVar11;
  size_t i;
  ulong uVar12;
  long lVar13;
  BoneList rootBones;
  _Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> local_40;
  
  uVar10 = (long)(this->subMeshes).
                 super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->subMeshes).
                 super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  dest->mNumMeshes = (uint)(uVar10 >> 3);
  ppaVar3 = (aiMesh **)operator_new__(uVar10 & 0x7fffffff8);
  dest->mMeshes = ppaVar3;
  paVar4 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar4);
  dest->mRootNode = paVar4;
  uVar10 = (ulong)dest->mNumMeshes;
  paVar4->mNumMeshes = dest->mNumMeshes;
  puVar5 = (uint *)operator_new__(uVar10 << 2);
  paVar4->mMeshes = puVar5;
  for (uVar12 = 0; uVar12 < uVar10; uVar12 = uVar12 + 1) {
    paVar6 = SubMeshXml::ConvertToAssimpMesh
                       ((this->subMeshes).
                        super__Vector_base<Assimp::Ogre::SubMeshXml_*,_std::allocator<Assimp::Ogre::SubMeshXml_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12],this);
    dest->mMeshes[uVar12] = paVar6;
    dest->mRootNode->mMeshes[uVar12] = (uint)uVar12;
    uVar10 = (ulong)dest->mNumMeshes;
  }
  this_00 = this->skeleton;
  if (this_00 != (Skeleton *)0x0) {
    if ((this_00->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this_00->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Skeleton::RootBones((BoneList *)&local_40,this_00);
      lVar11 = (long)local_40._M_impl.super__Vector_impl_data._M_finish -
               (long)local_40._M_impl.super__Vector_impl_data._M_start >> 3;
      dest->mRootNode->mNumChildren = (uint)lVar11;
      paVar4 = dest->mRootNode;
      ppaVar7 = (aiNode **)operator_new__((ulong)paVar4->mNumChildren << 3);
      paVar4->mChildren = ppaVar7;
      for (lVar13 = 0; lVar11 != lVar13; lVar13 = lVar13 + 1) {
        paVar4 = Bone::ConvertToAssimpNode
                           (local_40._M_impl.super__Vector_impl_data._M_start[lVar13],this->skeleton
                            ,dest->mRootNode);
        dest->mRootNode->mChildren[lVar13] = paVar4;
      }
      std::_Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::~_Vector_base
                (&local_40);
      this_00 = this->skeleton;
    }
    ppAVar1 = (this_00->animations).
              super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppAVar2 = (this_00->animations).
              super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppAVar1 != ppAVar2) {
      uVar10 = (long)ppAVar2 - (long)ppAVar1;
      dest->mNumAnimations = (uint)(uVar10 >> 3);
      ppaVar8 = (aiAnimation **)operator_new__(uVar10 & 0x7fffffff8);
      dest->mAnimations = ppaVar8;
      ppAVar1 = (this->skeleton->animations).
                super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppAVar2 = (this->skeleton->animations).
                super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (lVar11 = 0; (long)ppAVar1 - (long)ppAVar2 >> 3 != lVar11; lVar11 = lVar11 + 1) {
        paVar9 = Animation::ConvertToAssimpAnimation
                           ((this->skeleton->animations).
                            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar11]);
        dest->mAnimations[lVar11] = paVar9;
      }
    }
  }
  return;
}

Assistant:

void MeshXml::ConvertToAssimpScene(aiScene* dest)
{
    // Setup
    dest->mNumMeshes = static_cast<unsigned int>(NumSubMeshes());
    dest->mMeshes = new aiMesh*[dest->mNumMeshes];

    // Create root node
    dest->mRootNode = new aiNode();
    dest->mRootNode->mNumMeshes = dest->mNumMeshes;
    dest->mRootNode->mMeshes = new unsigned int[dest->mRootNode->mNumMeshes];

    // Export meshes
    for(size_t i=0; i<dest->mNumMeshes; ++i)
    {
        dest->mMeshes[i] = subMeshes[i]->ConvertToAssimpMesh(this);
        dest->mRootNode->mMeshes[i] = static_cast<unsigned int>(i);
    }

    // Export skeleton
    if (skeleton)
    {
        // Bones
        if (!skeleton->bones.empty())
        {
            BoneList rootBones = skeleton->RootBones();
            dest->mRootNode->mNumChildren = static_cast<unsigned int>(rootBones.size());
            dest->mRootNode->mChildren = new aiNode*[dest->mRootNode->mNumChildren];

            for(size_t i=0, len=rootBones.size(); i<len; ++i)
            {
                dest->mRootNode->mChildren[i] = rootBones[i]->ConvertToAssimpNode(skeleton, dest->mRootNode);
            }
        }

        // Animations
        if (!skeleton->animations.empty())
        {
            dest->mNumAnimations = static_cast<unsigned int>(skeleton->animations.size());
            dest->mAnimations = new aiAnimation*[dest->mNumAnimations];

            for(size_t i=0, len=skeleton->animations.size(); i<len; ++i)
            {
                dest->mAnimations[i] = skeleton->animations[i]->ConvertToAssimpAnimation();
            }
        }
    }
}